

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartMulticastSender.h
# Opt level: O2

bool __thiscall
ViconCGStream::VStartMulticastSender::Read(VStartMulticastSender *this,VBuffer *i_rBuffer)

{
  bool bVar1;
  
  bVar1 = ViconCGStreamIO::VBufferImpl::ReadPod<unsigned_int>
                    (&i_rBuffer->m_BufferImpl,&this->m_MulticastIpAddress);
  if (bVar1) {
    bVar1 = ViconCGStreamIO::VBufferImpl::ReadPod<unsigned_int>
                      (&i_rBuffer->m_BufferImpl,&this->m_SourceIpAddress);
    if (bVar1) {
      bVar1 = ViconCGStreamIO::VBufferImpl::ReadPod<unsigned_short>
                        (&i_rBuffer->m_BufferImpl,&this->m_Port);
      return bVar1;
    }
  }
  return false;
}

Assistant:

virtual bool Read( const ViconCGStreamIO::VBuffer & i_rBuffer )
  {
    return i_rBuffer.Read( m_MulticastIpAddress )
        && i_rBuffer.Read( m_SourceIpAddress )
        && i_rBuffer.Read( m_Port );
  }